

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssi.cpp
# Opt level: O0

void __thiscall pg::SSISolver::run(SSISolver *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  uintqueue *puVar10;
  long lVar11;
  ulong uVar12;
  uint *puVar13;
  int *piVar14;
  Error *this_00;
  ostream *poVar15;
  _label_vertex _Var16;
  int local_1a8;
  int local_1a0;
  bitset *local_180;
  size_t local_110;
  size_t v_4;
  size_t v_3;
  size_t v_2;
  size_t v_1;
  int solved_1;
  int count_1;
  int solved;
  int count;
  size_t remaining;
  int major;
  int minor;
  bitset local_c0;
  _label_vertex local_a0;
  Game *local_90;
  int local_88;
  _label_vertex local_80 [2];
  undefined1 local_60 [28];
  int u;
  int *curedge;
  undefined1 local_38 [4];
  int to;
  size_t local_28;
  size_t v;
  SSISolver *this_local;
  uintqueue *local_10;
  
  v = (size_t)this;
  bitset::operator=(&this->G,(this->super_Solver).disabled);
  bitset::flip(&this->G);
  bVar6 = bitset::none(&this->G);
  if (bVar6) {
    return;
  }
  sVar9 = bitset::find_last(&this->G);
  iVar7 = Solver::priority(&this->super_Solver,(int)sVar9);
  this->k = iVar7 + 1;
  puVar10 = &this->Q;
  lVar11 = Solver::nodecount(&this->super_Solver);
  this_local._4_4_ = (uint)lVar11;
  (this->Q).pointer = 0;
  local_10 = puVar10;
  if ((puVar10->queue != (uint *)0x0) && (puVar10->queue != (uint *)0x0)) {
    operator_delete__(puVar10->queue);
  }
  uVar12 = SUB168(ZEXT416(this_local._4_4_) * ZEXT816(4),0);
  if (SUB168(ZEXT416(this_local._4_4_) * ZEXT816(4),8) != 0) {
    uVar12 = 0xffffffffffffffff;
  }
  puVar13 = (uint *)operator_new__(uVar12);
  puVar10->queue = puVar13;
  sVar9 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->C,sVar9);
  sVar9 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->V,sVar9);
  sVar9 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->W0,sVar9);
  sVar9 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->W1,sVar9);
  sVar9 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->halt0,sVar9);
  sVar9 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->halt1,sVar9);
  sVar9 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->V0,sVar9);
  sVar9 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->V1,sVar9);
  iVar7 = this->k;
  lVar11 = Solver::nodecount(&this->super_Solver);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = iVar7 * lVar11;
  uVar12 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar12 = 0xffffffffffffffff;
  }
  piVar14 = (int *)operator_new__(uVar12);
  this->val = piVar14;
  uVar12 = Solver::nodecount(&this->super_Solver);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar12;
  uVar12 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar12 = 0xffffffffffffffff;
  }
  piVar14 = (int *)operator_new__(uVar12);
  this->str0 = piVar14;
  uVar12 = Solver::nodecount(&this->super_Solver);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar12;
  uVar12 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar12 = 0xffffffffffffffff;
  }
  piVar14 = (int *)operator_new__(uVar12);
  this->str1 = piVar14;
  uVar12 = Solver::nodecount(&this->super_Solver);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar12;
  uVar12 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar12 = 0xffffffffffffffff;
  }
  piVar14 = (int *)operator_new__(uVar12);
  this->first_in = piVar14;
  uVar12 = Solver::nodecount(&this->super_Solver);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar12;
  uVar12 = SUB168(auVar5 * ZEXT816(4),0);
  if (SUB168(auVar5 * ZEXT816(4),8) != 0) {
    uVar12 = 0xffffffffffffffff;
  }
  piVar14 = (int *)operator_new__(uVar12);
  this->next_in = piVar14;
  for (local_28 = bitset::find_first(&this->G); local_28 != 0xffffffffffffffff;
      local_28 = bitset::find_next(&this->G,local_28)) {
    iVar7 = Solver::owner(&this->super_Solver,(int)local_28);
    if (iVar7 == 0) {
      local_180 = &this->V0;
    }
    else {
      local_180 = &this->V1;
    }
    bitset::operator[]((bitset *)local_38,(size_t)local_180);
    bitset::reference::operator=((reference *)local_38,true);
    curedge._4_4_ = -1;
    for (register0x00000000 = Solver::outs(&this->super_Solver,(int)local_28);
        *stack0xffffffffffffffb8 != -1; register0x00000000 = stack0xffffffffffffffb8 + 1) {
      local_60._20_4_ = *stack0xffffffffffffffb8;
      bitset::operator[]((bitset *)local_60,(size_t)&this->G);
      bVar6 = bitset::reference::operator_cast_to_bool((reference *)local_60);
      if (bVar6) {
        curedge._4_4_ = local_60._20_4_;
        break;
      }
    }
    if (curedge._4_4_ == -1) {
      this_00 = (Error *)__cxa_allocate_exception(0x40);
      Error::Error(this_00,"logic error",
                   "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/ssi.cpp"
                   ,0x19a);
      __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
    }
    if (1 < (this->super_Solver).trace) {
      poVar15 = std::operator<<((this->super_Solver).logger,"initial strategy: ");
      _Var16 = Solver::label_vertex(&this->super_Solver,(int)local_28);
      local_90 = _Var16.g;
      local_88 = _Var16.v;
      local_80[0].g = local_90;
      local_80[0].v = local_88;
      poVar15 = operator<<(poVar15,local_80);
      poVar15 = std::operator<<(poVar15," => ");
      _Var16 = Solver::label_vertex(&this->super_Solver,curedge._4_4_);
      local_c0._bitssize = (size_t)_Var16.g;
      local_c0._allocsize._0_4_ = _Var16.v;
      local_a0.g = (Game *)local_c0._bitssize;
      local_a0.v = (int)local_c0._allocsize;
      poVar15 = operator<<(poVar15,&local_a0);
      std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
    }
    this->str0[local_28] = curedge._4_4_;
    this->str1[local_28] = curedge._4_4_;
    uVar8 = Solver::priority(&this->super_Solver,(int)local_28);
    if ((uVar8 & 1) == 0) {
      bitset::operator[]((bitset *)&major,(size_t)&this->halt1);
      bitset::reference::operator=((reference *)&major,true);
    }
    else {
      bitset::operator[](&local_c0,(size_t)&this->halt0);
      bitset::reference::operator=((reference *)&local_c0,true);
    }
  }
  remaining._4_4_ = 0;
  remaining._0_4_ = 0;
  _solved = bitset::count(&this->G);
  do {
    while( true ) {
      remaining._0_4_ = (int)remaining + 1;
      if ((this->super_Solver).trace != 0) {
        poVar15 = std::operator<<((this->super_Solver).logger,"\x1b[1;38;5;208mMajor iteration ");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,(int)remaining);
        poVar15 = std::operator<<(poVar15,"\x1b[m");
        std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
      }
      if ((this->super_Solver).trace != 0) {
        poVar15 = std::operator<<((this->super_Solver).logger,"Computing Odd\'s best response...");
        std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
      }
      do {
        remaining._4_4_ = remaining._4_4_ + 1;
        compute_vals_ll(this,0);
        iVar7 = switch_opp_strategy(this,0);
      } while (iVar7 != 0);
      iVar7 = mark_solved(this,0);
      if (iVar7 == 0) break;
joined_r0x001f1d0f:
      _solved = _solved - (long)iVar7;
      if (_solved == 0) goto LAB_001f1fff;
    }
    if ((this->super_Solver).trace != 0) {
      poVar15 = std::operator<<((this->super_Solver).logger,"Computing Even\'s best response...");
      std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
    }
    do {
      remaining._4_4_ = remaining._4_4_ + 1;
      compute_vals_ll(this,1);
      iVar7 = switch_opp_strategy(this,1);
    } while (iVar7 != 0);
    iVar7 = mark_solved(this,1);
    if (iVar7 != 0) goto joined_r0x001f1d0f;
    if ((this->super_Solver).trace != 0) {
      poVar15 = std::operator<<((this->super_Solver).logger,"Improving Odd\'s strategy...");
      std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
    }
    iVar7 = switch_sym_strategy(this,1);
    if (iVar7 == 0) {
      if ((this->super_Solver).trace != 0) {
        poVar15 = std::operator<<((this->super_Solver).logger,
                                  "No (possible) improvements - Even wins remainder.");
        std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
      }
      bitset::operator|=(&this->W0,&this->G);
      for (v_2 = bitset::find_first(&this->G); v_2 != 0xffffffffffffffff;
          v_2 = bitset::find_next(&this->G,v_2)) {
        this->str0[v_2] = this->str1[v_2];
      }
      goto LAB_001f1fff;
    }
    if ((this->super_Solver).trace != 0) {
      poVar15 = std::operator<<((this->super_Solver).logger,"Improving Even\'s strategy...");
      std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
    }
    compute_vals_ll(this,0);
    iVar7 = switch_sym_strategy(this,0);
  } while (iVar7 != 0);
  if ((this->super_Solver).trace != 0) {
    poVar15 = std::operator<<((this->super_Solver).logger,
                              "No (possible) improvements - Odd wins remainder.");
    std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
  }
  bitset::operator|=(&this->W1,&this->G);
  for (v_3 = bitset::find_first(&this->G); v_3 != 0xffffffffffffffff;
      v_3 = bitset::find_next(&this->G,v_3)) {
    this->str1[v_3] = this->str0[v_3];
  }
LAB_001f1fff:
  for (v_4 = bitset::find_first(&this->W0); v_4 != 0xffffffffffffffff;
      v_4 = bitset::find_next(&this->W0,v_4)) {
    iVar7 = Solver::owner(&this->super_Solver,(int)v_4);
    if (iVar7 == 0) {
      local_1a0 = this->str0[v_4];
    }
    else {
      local_1a0 = -1;
    }
    Solver::solve(&this->super_Solver,(int)v_4,0,local_1a0);
  }
  for (local_110 = bitset::find_first(&this->W1); local_110 != 0xffffffffffffffff;
      local_110 = bitset::find_next(&this->W1,local_110)) {
    iVar7 = Solver::owner(&this->super_Solver,(int)local_110);
    if (iVar7 == 1) {
      local_1a8 = this->str1[local_110];
    }
    else {
      local_1a8 = -1;
    }
    Solver::solve(&this->super_Solver,(int)local_110,1,local_1a8);
  }
  if (this->val != (int *)0x0) {
    operator_delete__(this->val);
  }
  if (this->first_in != (int *)0x0) {
    operator_delete__(this->first_in);
  }
  if (this->next_in != (int *)0x0) {
    operator_delete__(this->next_in);
  }
  if (this->str0 != (int *)0x0) {
    operator_delete__(this->str0);
  }
  if (this->str1 != (int *)0x0) {
    operator_delete__(this->str1);
  }
  poVar15 = std::operator<<((this->super_Solver).logger,"solved with ");
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,(int)remaining);
  poVar15 = std::operator<<(poVar15," major iterations, ");
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,remaining._4_4_);
  poVar15 = std::operator<<(poVar15," minor iterations.");
  std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
SSISolver::run()
{
    // set G to the game
    G = disabled;
    G.flip();
    if (G.none()) return; // nothing to do

    // assume the game is ordered
    k = 1 + priority(G.find_last());

    Q.resize(nodecount());
    C.resize(nodecount());
    V.resize(nodecount());
    W0.resize(nodecount());
    W1.resize(nodecount());
    halt0.resize(nodecount());
    halt1.resize(nodecount());
    V0.resize(nodecount());
    V1.resize(nodecount());

    val = new int[k*nodecount()];
    str0 = new int[nodecount()];
    str1 = new int[nodecount()];

    first_in = new int[nodecount()];
    next_in = new int[nodecount()];

    // initialize the datastructure
    for (auto v = G.find_first(); v != bitset::npos; v = G.find_next(v)) {
        // set V0 or V1
        (owner(v) == 0 ? V0 : V1)[v] = true;
        // select first available edge
        int to = -1;
        for (auto curedge = outs(v); *curedge != -1; curedge++) {
            int u = *curedge;
            if (G[u]) {
                to = u;
                break;
            }
        }
        if (to == -1) LOGIC_ERROR;
#ifndef NDEBUG
        if (trace >= 2) {
            logger << "initial strategy: " << label_vertex(v) << " => " << label_vertex(to) << std::endl;
        }
#endif
        // set initial strategy of <v> to <to>.
        str0[v] = to;
        str1[v] = to;
        // halt for the right player
        if (priority(v)&1) {
            // odd priority, so halt for even
            halt0[v] = true;
        } else {
            // even priority, so halt for odd
            halt1[v] = true;
        }
    }

    int minor = 0, major = 0;
    auto remaining = G.count();

    for (;;) {
        ++major;
        if (trace) {
            logger << "\033[1;38;5;208mMajor iteration " << major << "\033[m" << std::endl;
        }
        {
            // First compute Odd's best response for Even's strategy
            if (trace) logger << "Computing Odd's best response..." << std::endl;
            for (;;) {
                ++minor;
                compute_vals_ll(0);
                int count = switch_opp_strategy(0);
                if (count == 0) break; // if nothing left, done
            }
            int solved = mark_solved(0); // mark nodes won by Even after Odd's best response
            if (solved != 0) {
                remaining -= solved;
                if (remaining <= 0) break;
                continue; // restart major loop
            }
        }
        {
            // Now compute Even's best response for Odd's strategy
            if (trace) logger << "Computing Even's best response..." << std::endl;
            for (;;) {
                ++minor;
                compute_vals_ll(1);
                int count = switch_opp_strategy(1);
                if (count == 0) break; // if nothing left, done
            }
            int solved = mark_solved(1); // mark nodes won by Odd after Even's best response
            if (solved != 0) {
                remaining -= solved;
                if (remaining <= 0) break;
                continue; // restart major loop
            }
        }
        if (trace) logger << "Improving Odd's strategy..." << std::endl;
        if (switch_sym_strategy(1) == 0) {
            // Now all vertices not in a winning region are won by Even with strategy str1
            if (trace) logger << "No (possible) improvements - Even wins remainder." << std::endl;
            W0 |= G;
            for (auto v = G.find_first(); v != bitset::npos; v = G.find_next(v)) {
                str0[v] = str1[v];
            }
            break;
        }
        if (trace) logger << "Improving Even's strategy..." << std::endl;
        compute_vals_ll(0);
        if (switch_sym_strategy(0) == 0) {
            // Now all vertices not in a winning region are won by Odd with strategy str0
            if (trace) logger << "No (possible) improvements - Odd wins remainder." << std::endl;
            W1 |= G;
            for (auto v = G.find_first(); v != bitset::npos; v = G.find_next(v)) {
                str1[v] = str0[v];
            }
            break;
        }
    }

    for (auto v = W0.find_first(); v != bitset::npos; v = W0.find_next(v)) {
        Solver::solve(v, 0, owner(v) == 0 ? str0[v] : -1);
    }

    for (auto v = W1.find_first(); v != bitset::npos; v = W1.find_next(v)) {
        Solver::solve(v, 1, owner(v) == 1 ? str1[v] : -1);
    }

    delete[] val;
    delete[] first_in;
    delete[] next_in;
    delete[] str0;
    delete[] str1;

    logger << "solved with " << major << " major iterations, " << minor << " minor iterations." << std::endl;
}